

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O1

int bcf_sr_set_targets(bcf_srs_t *readers,char *targets,int is_file,int alleles)

{
  bcf_sr_regions_t *pbVar1;
  int iVar2;
  
  if (readers->targets == (bcf_sr_regions_t *)0x0) {
    if (*targets == '^') {
      readers->targets_exclude = 1;
      targets = targets + 1;
    }
    iVar2 = 0;
    pbVar1 = bcf_sr_regions_init(targets,is_file,0,1,-2);
    readers->targets = pbVar1;
    if (pbVar1 == (bcf_sr_regions_t *)0x0) {
      iVar2 = -1;
    }
    else {
      readers->targets_als = alleles;
    }
    return iVar2;
  }
  __assert_fail("!readers->targets",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/synced_bcf_reader.c"
                ,0x78,"int bcf_sr_set_targets(bcf_srs_t *, const char *, int, int)");
}

Assistant:

int bcf_sr_set_targets(bcf_srs_t *readers, const char *targets, int is_file, int alleles)
{
    assert( !readers->targets );
    if ( targets[0]=='^' )
    {
        readers->targets_exclude = 1;
        targets++;
    }
    readers->targets = bcf_sr_regions_init(targets,is_file,0,1,-2);
    if ( !readers->targets ) return -1;
    readers->targets_als = alleles;
    return 0;
}